

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EratSmall.cpp
# Opt level: O1

void __thiscall
primesieve::EratSmall::storeSievingPrime
          (EratSmall *this,uint64_t prime,uint64_t multipleIndex,uint64_t wheelIndex)

{
  SievingPrime *pSVar1;
  
  if ((this->primes_).end_ == (this->primes_).capacity_) {
    storeSievingPrime();
  }
  pSVar1 = (this->primes_).end_;
  pSVar1->indexes_ = (uint)multipleIndex | (int)wheelIndex << 0x17;
  pSVar1->sievingPrime_ = (uint32_t)(prime / 0x1e);
  (this->primes_).end_ = pSVar1 + 1;
  return;
}

Assistant:

void EratSmall::storeSievingPrime(uint64_t prime,
                                  uint64_t multipleIndex,
                                  uint64_t wheelIndex)
{
  ASSERT(prime <= maxPrime_);
  uint64_t sievingPrime = prime / 30;
  primes_.emplace_back(sievingPrime, multipleIndex, wheelIndex);
}